

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O2

void DC16_C(uint8_t *dst)

{
  byte *pbVar1;
  long lVar2;
  uint uVar3;
  
  pbVar1 = dst + -0x20;
  uVar3 = 0x10;
  for (lVar2 = -1; lVar2 != 0x1ff; lVar2 = lVar2 + 0x20) {
    uVar3 = uVar3 + dst[lVar2] + (uint)*pbVar1;
    pbVar1 = pbVar1 + 1;
  }
  Put16(uVar3 >> 5,dst);
  return;
}

Assistant:

static void DC16_C(uint8_t* dst) {    // DC
  int DC = 16;
  int j;
  for (j = 0; j < 16; ++j) {
    DC += dst[-1 + j * BPS] + dst[j - BPS];
  }
  Put16(DC >> 5, dst);
}